

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O2

void __thiscall
cmDebugServerConsole::OnBreakpoint(cmDebugServerConsole *this,breakpoint_id breakpoint)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1b8;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(&local_188,"# Breakpoint ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," hit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,(string *)&PROMPT_abi_cxx11_);
  std::__cxx11::stringbuf::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void cmDebugServerConsole::OnBreakpoint(breakpoint_id breakpoint)
{
  std::stringstream ss;
  ss << "# Breakpoint " << breakpoint << " hit" << std::endl << PROMPT;

  AsyncBroadcast(ss.str());
}